

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O0

int Abc_SopGetPhase(char *pSop)

{
  int iVar1;
  int nVars;
  char *pSop_local;
  
  iVar1 = Abc_SopGetVarNum(pSop);
  if ((pSop[iVar1 + 1] == '0') || (pSop[iVar1 + 1] == 'n')) {
    pSop_local._4_4_ = 0;
  }
  else {
    if ((pSop[iVar1 + 1] != '1') && (pSop[iVar1 + 1] != 'x')) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcSop.c"
                    ,0x233,"int Abc_SopGetPhase(char *)");
    }
    pSop_local._4_4_ = 1;
  }
  return pSop_local._4_4_;
}

Assistant:

int Abc_SopGetPhase( char * pSop )
{
    int nVars = Abc_SopGetVarNum( pSop );
    if ( pSop[nVars+1] == '0' || pSop[nVars+1] == 'n' )
        return 0;
    if ( pSop[nVars+1] == '1' || pSop[nVars+1] == 'x' )
        return 1;
    assert( 0 );
    return -1;
}